

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.c
# Opt level: O0

void lz_decoder_end(lzma_coder_conflict5 *coder,lzma_allocator *allocator)

{
  lzma_allocator *allocator_local;
  lzma_coder_conflict5 *coder_local;
  
  lzma_next_end((lzma_next_coder *)&coder->next,allocator);
  lzma_free((coder->dict).buf,allocator);
  if ((coder->lz).end == (_func_void_lzma_coder_ptr_lzma_allocator_ptr_conflict3 *)0x0) {
    lzma_free((coder->lz).coder,allocator);
  }
  else {
    (*(coder->lz).end)((coder->lz).coder,allocator);
  }
  lzma_free(coder,allocator);
  return;
}

Assistant:

static void
lz_decoder_end(lzma_coder *coder, lzma_allocator *allocator)
{
	lzma_next_end(&coder->next, allocator);
	lzma_free(coder->dict.buf, allocator);

	if (coder->lz.end != NULL)
		coder->lz.end(coder->lz.coder, allocator);
	else
		lzma_free(coder->lz.coder, allocator);

	lzma_free(coder, allocator);
	return;
}